

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O1

int mbedtls_mpi_core_read_le(mbedtls_mpi_uint *X,size_t X_limbs,uchar *input,size_t input_length)

{
  ulong *puVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  
  iVar4 = -8;
  if (((input_length >> 3) + 1) - (ulong)((input_length & 7) == 0) <= X_limbs) {
    if (X == (mbedtls_mpi_uint *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = 0;
      memset(X,0,X_limbs << 3);
      if (input_length != 0) {
        iVar4 = 0;
        bVar2 = 0;
        uVar3 = 0;
        do {
          puVar1 = (ulong *)((long)X + (uVar3 & 0xfffffffffffffff8));
          *puVar1 = *puVar1 | (ulong)input[uVar3] << (bVar2 & 0x38);
          uVar3 = uVar3 + 1;
          bVar2 = bVar2 + 8;
        } while (input_length != uVar3);
      }
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_mpi_core_read_le(mbedtls_mpi_uint *X,
                             size_t X_limbs,
                             const unsigned char *input,
                             size_t input_length)
{
    const size_t limbs = CHARS_TO_LIMBS(input_length);

    if (X_limbs < limbs) {
        return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
    }

    if (X != NULL) {
        memset(X, 0, X_limbs * ciL);

        for (size_t i = 0; i < input_length; i++) {
            size_t offset = ((i % ciL) << 3);
            X[i / ciL] |= ((mbedtls_mpi_uint) input[i]) << offset;
        }
    }

    return 0;
}